

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Word.cpp
# Opt level: O2

string * __thiscall Word::getWord_abi_cxx11_(string *__return_storage_ptr__,Word *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

string Word::getWord()
{
    return _word;
}